

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O3

void __thiscall Rectangle::Rectangle(Rectangle *this,Vector *l,Vector *s1,Vector *s2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_0010ba40
  ;
  dVar5 = l->x;
  dVar6 = l->y;
  (this->loc).x = dVar5;
  (this->loc).y = dVar6;
  dVar1 = l->z;
  (this->loc).z = dVar1;
  dVar2 = s1->x;
  (this->side1).x = dVar2;
  dVar3 = s2->x;
  (this->side2).x = dVar3;
  dVar7 = s1->y;
  dVar8 = s1->z;
  (this->side1).y = dVar7;
  (this->side1).z = dVar8;
  dVar9 = s2->y;
  dVar10 = s2->z;
  (this->side2).y = dVar9;
  (this->side2).z = dVar10;
  auVar17._0_8_ = dVar10 * dVar7 - dVar8 * dVar9;
  auVar17._8_8_ = dVar3 * dVar8 - dVar2 * dVar10;
  dVar14 = dVar2 * dVar9 - dVar3 * dVar7;
  auVar19._0_8_ =
       SQRT(dVar14 * dVar14 + auVar17._0_8_ * auVar17._0_8_ + auVar17._8_8_ * auVar17._8_8_);
  auVar19._8_8_ = auVar19._0_8_;
  auVar18 = divpd(auVar17,auVar19);
  (this->n).x = (double)auVar18._0_8_;
  (this->n).y = (double)auVar18._8_8_;
  (this->n).z = dVar14 / auVar19._0_8_;
  dVar13 = dVar10 * dVar8 + dVar2 * dVar3 + dVar7 * dVar9;
  dVar15 = dVar10 * dVar10 + dVar3 * dVar3 + dVar9 * dVar9;
  dVar16 = dVar8 * dVar8 + dVar2 * dVar2 + dVar7 * dVar7;
  dVar14 = dVar16 * dVar15 - dVar15 * dVar13;
  auVar12._0_8_ = dVar2 * dVar15 - dVar3 * dVar13;
  auVar12._8_8_ = dVar3 * dVar16 - dVar2 * dVar13;
  auVar18._8_8_ = dVar14;
  auVar18._0_8_ = dVar14;
  auVar12 = divpd(auVar12,auVar18);
  auVar20._0_8_ = dVar7 * dVar15 - dVar9 * dVar13;
  auVar20._8_8_ = dVar9 * dVar16 - dVar7 * dVar13;
  auVar21._8_8_ = dVar14;
  auVar21._0_8_ = dVar14;
  auVar21 = divpd(auVar20,auVar21);
  (this->ku).x = auVar12._0_8_;
  (this->ku).y = auVar21._0_8_;
  auVar11._0_8_ = dVar8 * dVar15 - dVar13 * dVar10;
  auVar11._8_8_ = dVar10 * dVar16 - dVar13 * dVar8;
  auVar4._8_8_ = dVar14;
  auVar4._0_8_ = dVar14;
  auVar18 = divpd(auVar11,auVar4);
  (this->ku).z = auVar18._0_8_;
  (this->kv).x = auVar12._8_8_;
  (this->kv).y = auVar21._8_8_;
  (this->kv).z = auVar18._8_8_;
  this->u0 = -(dVar1 * auVar18._0_8_ + dVar5 * auVar12._0_8_ + dVar6 * auVar21._0_8_);
  this->v0 = -(dVar1 * auVar18._8_8_ + dVar5 * auVar12._8_8_ + dVar6 * auVar21._8_8_);
  return;
}

Assistant:

Rectangle::Rectangle( const Vector& l, const Vector& s1, const Vector& s2  )
{
   loc   = l;
   side1 =  s1;
   side2 =  s2;
   n =   normalize( side1 ^ side2 );

   double s11 = side1 & side1;
   double s12 = side1 & side2;
   double s22 = side2 & side2;
   double d = s11 * s22 - s12 * s22; // determinant

   ku = (side1 * s22 -  side2 *  s12) / d;
   kv = (side2 * s11 -  side1 *  s12) / d;
   u0 = -(loc & ku);
   v0 = -(loc & kv);
}